

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

ConversionError *
CLI::ConversionError::TooManyInputsFlag(ConversionError *__return_storage_ptr__,string *name)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_38;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  ::std::__cxx11::string::append((char *)&local_38);
  ConversionError(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static ConversionError TooManyInputsFlag(std::string name) {
        return ConversionError(name + ": too many inputs for a flag");
    }